

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

void ZSTD_seqToCodes(seqStore_t *seqStorePtr)

{
  ushort uVar1;
  seqDef *psVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  int iVar6;
  BYTE BVar7;
  ulong uVar8;
  ulong uVar9;
  
  psVar2 = seqStorePtr->sequencesStart;
  pBVar3 = seqStorePtr->llCode;
  pBVar4 = seqStorePtr->mlCode;
  uVar8 = (ulong)((long)seqStorePtr->sequences - (long)psVar2) >> 3;
  if ((int)uVar8 != 0) {
    pBVar5 = seqStorePtr->ofCode;
    uVar9 = 0;
    do {
      uVar1 = psVar2[uVar9].litLength;
      if (uVar1 < 0x40) {
        BVar7 = ZSTD_LLcode_LL_Code[(uint)uVar1];
      }
      else {
        iVar6 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        BVar7 = '2' - ((byte)iVar6 ^ 0x1f);
      }
      uVar1 = psVar2[uVar9].matchLength;
      pBVar3[uVar9] = BVar7;
      iVar6 = 0x1f;
      if (psVar2[uVar9].offset != 0) {
        for (; psVar2[uVar9].offset >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      pBVar5[uVar9] = (BYTE)iVar6;
      if (uVar1 < 0x80) {
        BVar7 = ZSTD_MLcode_ML_Code[(uint)uVar1];
      }
      else {
        iVar6 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        BVar7 = 'C' - ((byte)iVar6 ^ 0x1f);
      }
      pBVar4[uVar9] = BVar7;
      uVar9 = uVar9 + 1;
    } while ((uVar8 & 0xffffffff) != uVar9);
  }
  if (seqStorePtr->longLengthID == 1) {
    pBVar3[seqStorePtr->longLengthPos] = '#';
  }
  if (seqStorePtr->longLengthID == 2) {
    pBVar4[seqStorePtr->longLengthPos] = '4';
  }
  return;
}

Assistant:

void ZSTD_seqToCodes(const seqStore_t* seqStorePtr)
{
    const seqDef* const sequences = seqStorePtr->sequencesStart;
    BYTE* const llCodeTable = seqStorePtr->llCode;
    BYTE* const ofCodeTable = seqStorePtr->ofCode;
    BYTE* const mlCodeTable = seqStorePtr->mlCode;
    U32 const nbSeq = (U32)(seqStorePtr->sequences - seqStorePtr->sequencesStart);
    U32 u;
    for (u=0; u<nbSeq; u++) {
        U32 const llv = sequences[u].litLength;
        U32 const mlv = sequences[u].matchLength;
        llCodeTable[u] = (BYTE)ZSTD_LLcode(llv);
        ofCodeTable[u] = (BYTE)ZSTD_highbit32(sequences[u].offset);
        mlCodeTable[u] = (BYTE)ZSTD_MLcode(mlv);
    }
    if (seqStorePtr->longLengthID==1)
        llCodeTable[seqStorePtr->longLengthPos] = MaxLL;
    if (seqStorePtr->longLengthID==2)
        mlCodeTable[seqStorePtr->longLengthPos] = MaxML;
}